

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_blob_detection.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  uint32_t uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined2 uVar4;
  undefined2 uVar5;
  uchar *puVar6;
  undefined4 uVar7;
  uint8_t uVar8;
  vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_> *pvVar9;
  BlobInfo *this;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar10;
  ostream *poVar11;
  imageException *this_00;
  size_t i;
  ulong uVar12;
  allocator local_169;
  Image local_168;
  undefined1 local_140 [32];
  uint8_t local_120;
  BlobDetection detection;
  vector<unsigned_int,_std::allocator<unsigned_int>_> histogram;
  string filePath;
  
  std::__cxx11::string::string((string *)&filePath,"mercury.bmp",(allocator *)&local_168);
  if (1 < argc) {
    std::__cxx11::string::assign((char *)&filePath);
  }
  Bitmap_Operation::Load(&local_168,&filePath);
  if (local_168._data != (uchar *)0x0) {
    if (local_168._colorCount != '\x01') {
      Image_Function::ConvertToGrayScale((Image *)local_140,&local_168);
      uVar8 = local_120;
      uVar7 = local_140._20_4_;
      uVar2 = local_140._8_8_;
      puVar6 = local_168._data;
      uVar4 = local_168._16_2_;
      local_140._8_4_ = local_168._width;
      local_140._12_4_ = local_168._height;
      uVar3 = local_140._8_8_;
      local_140._8_4_ = (undefined4)uVar2;
      local_140._12_4_ = SUB84(uVar2,4);
      local_168._width = local_140._8_4_;
      local_168._height = local_140._12_4_;
      local_168._colorCount = local_140[0x10];
      local_168._alignment = local_140[0x11];
      uVar5 = local_168._16_2_;
      local_168._colorCount = (uint8_t)uVar4;
      local_168._alignment = SUB21(uVar4,1);
      local_140[0x10] = local_168._colorCount;
      local_140[0x11] = local_168._alignment;
      local_140._20_4_ = local_168._rowSize;
      local_168._rowSize = uVar7;
      local_168._data = (uchar *)local_140._24_8_;
      local_140._24_8_ = puVar6;
      local_120 = local_168._type;
      local_168._type = uVar8;
      local_168._16_2_ = uVar5;
      local_140._8_8_ = uVar3;
      PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
                ((ImageTemplate<unsigned_char> *)local_140);
    }
    Image_Function::Histogram(&histogram,&local_168);
    uVar8 = Image_Function::GetThreshold(&histogram);
    Image_Function::Threshold((Image *)local_140,&local_168,uVar8);
    uVar8 = local_168._type;
    puVar6 = local_168._data;
    uVar1 = local_168._rowSize;
    uVar4 = local_168._16_2_;
    uVar2 = local_168._8_8_;
    local_168._width = local_140._8_4_;
    local_168._height = local_140._12_4_;
    uVar3 = local_168._8_8_;
    local_168._width = (uint32_t)uVar2;
    local_168._height = SUB84(uVar2,4);
    local_140._8_4_ = local_168._width;
    local_140._12_4_ = local_168._height;
    local_168._colorCount = local_140[0x10];
    local_168._alignment = local_140[0x11];
    uVar5 = local_168._16_2_;
    local_168._colorCount = (uint8_t)uVar4;
    local_168._alignment = SUB21(uVar4,1);
    local_140[0x10] = local_168._colorCount;
    local_140[0x11] = local_168._alignment;
    local_168._rowSize = local_140._20_4_;
    local_140._20_4_ = uVar1;
    local_168._data = (uchar *)local_140._24_8_;
    local_140._24_8_ = puVar6;
    local_168._type = local_120;
    local_120 = uVar8;
    local_168._8_8_ = uVar3;
    local_168._16_2_ = uVar5;
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate
              ((ImageTemplate<unsigned_char> *)local_140);
    detection._blob.
    super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    detection._blob.
    super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    detection._blob.
    super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    Blob_Detection::BlobDetection::find
              (&detection,&local_168,(BlobParameters)ZEXT72144(ZEXT872(0) << 0x40),'\x01');
    pvVar9 = Blob_Detection::BlobDetection::operator()(&detection);
    if ((pvVar9->
        super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>).
        _M_impl.super__Vector_impl_data._M_start !=
        (pvVar9->
        super__Vector_base<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>).
        _M_impl.super__Vector_impl_data._M_finish) {
      this = Blob_Detection::BlobDetection::getBestBlob(&detection,CRITERION_SIZE);
      PenguinV_Image::ImageTemplate<unsigned_char>::fill(&local_168,'\0');
      uVar12 = 0;
      while( true ) {
        pvVar10 = Blob_Detection::BlobInfo::contourX(this);
        if ((ulong)((long)(pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                          ._M_impl.super__Vector_impl_data._M_start >> 2) <= uVar12) break;
        pvVar10 = Blob_Detection::BlobInfo::contourX(this);
        uVar1 = (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start[uVar12];
        pvVar10 = Blob_Detection::BlobInfo::contourY(this);
        Image_Function::SetPixel
                  (&local_168,uVar1,
                   (pvVar10->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start[uVar12],0xff);
        uVar12 = uVar12 + 1;
      }
    }
    std::__cxx11::string::string((string *)local_140,"result.bmp",&local_169);
    Bitmap_Operation::Save((string *)local_140,&local_168);
    std::__cxx11::string::~string((string *)local_140);
    std::vector<Blob_Detection::BlobInfo,_std::allocator<Blob_Detection::BlobInfo>_>::~vector
              (&detection._blob);
    std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
              (&histogram.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
    PenguinV_Image::ImageTemplate<unsigned_char>::~ImageTemplate(&local_168);
    poVar11 = std::operator<<((ostream *)&std::cout,"Application ended correctly.");
    std::endl<char,std::char_traits<char>>(poVar11);
    std::__cxx11::string::~string((string *)&filePath);
    return 0;
  }
  this_00 = (imageException *)__cxa_allocate_exception(0x28);
  std::__cxx11::string::string((string *)&histogram,"Cannot load ",(allocator *)&detection);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_140,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&histogram,
                 &filePath);
  imageException::imageException(this_00,(string *)local_140);
  __cxa_throw(this_00,&imageException::typeinfo,imageException::~imageException);
}

Assistant:

int main( int argc, char * argv[] )
{
    std::string filePath = "mercury.bmp"; // default image path
    if ( argc > 1 ) // Check input data
        filePath = argv[1];

    try // <---- do not forget to put your code into try.. catch block!
    {
        // Load image from storage
        PenguinV_Image::Image image = Bitmap_Operation::Load( filePath );

        // If the image is empty it means that the image doesn't exist or the file is not readable
        if ( image.empty() )
            throw imageException( std::string("Cannot load ") + filePath );

        // Convert to gray-scale image if it's not
        if ( image.colorCount() != PenguinV_Image::GRAY_SCALE )
            image = Image_Function::ConvertToGrayScale( image );

        // Threshold image with calculated optimal threshold
        const std::vector< uint32_t > histogram = Image_Function::Histogram( image );
        const uint8_t thresholdValue = Image_Function::GetThreshold( histogram );
        image = Image_Function::Threshold( image, thresholdValue );

        // Search all possible blobs on image
        Blob_Detection::BlobDetection detection;
        detection.find( image );

        if ( !detection().empty() ) {
            // okay, our image contains some blobs
            // extract a biggest one
            const Blob_Detection::BlobInfo & blob = detection.getBestBlob( Blob_Detection::BlobDetection::CRITERION_SIZE );

            // clear image and draw contour of found blob
            image.fill( 0 );

            for ( size_t i = 0; i < blob.contourX().size(); ++i )
                Image_Function::SetPixel( image, blob.contourX()[i], blob.contourY()[i], 255u );
        }

        // Save result into file
        Bitmap_Operation::Save( "result.bmp", image );
    }
    catch ( const std::exception & ex ) { // uh-oh, something went wrong!
        std::cout << ex.what() << ". Press any button to continue." << std::endl;
        std::cin.ignore();
        return 1;
    }
    catch ( ... ) { // uh-oh, something terrible happen!
        std::cout << "Generic exception raised. Press any button to continue." << std::endl;
        std::cin.ignore();
        return 2;
    }

    std::cout << "Application ended correctly." << std::endl;
    return 0;
}